

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

string * __thiscall
t_lua_generator::lua_includes_abi_cxx11_(string *__return_storage_ptr__,t_lua_generator *this)

{
  allocator local_2d [20];
  allocator local_19;
  t_lua_generator *local_18;
  t_lua_generator *this_local;
  
  local_18 = this;
  this_local = (t_lua_generator *)__return_storage_ptr__;
  if ((this->gen_requires_ & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\n\nrequire \'Thrift\'",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_lua_generator::lua_includes() {
  if (gen_requires_) {
    return "\n\nrequire 'Thrift'";
  } else {
    return "";
  }
}